

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O3

int read_AEDR(coda_cdf_product *product_file,int64_t offset,char *name,int32_t scope)

{
  long lVar1;
  coda_cdf_variable *type;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  int iVar25;
  int iVar26;
  char *message;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  coda_dynamic_type *attribute;
  int32_t local_64;
  int local_60;
  int local_5c;
  undefined4 local_58;
  int local_54;
  ulong local_50;
  coda_dynamic_type *local_48;
  ulong local_40;
  long local_38;
  
  if (offset == 0) {
    return 0;
  }
  iVar25 = read_bytes(product_file->raw_product,offset + 8,4,&local_54);
  if (iVar25 < 0) {
    return -1;
  }
  auVar27 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_54 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_54 >> 0x10),local_54))
                                                  >> 0x20),local_54) >> 0x18),
                                      (char)((uint)local_54 >> 8)),(ushort)(byte)local_54) &
                    0xffffff00ffffff);
  auVar27 = pshuflw(auVar27,auVar27,0x1b);
  sVar5 = auVar27._0_2_;
  sVar6 = auVar27._2_2_;
  sVar7 = auVar27._4_2_;
  sVar8 = auVar27._6_2_;
  iVar25 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar27[6] - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar27[4] - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar27[2] - (0xff < sVar6),
                                      (0 < sVar5) * (sVar5 < 0x100) * auVar27[0] - (0xff < sVar5))))
  ;
  local_54 = iVar25;
  if ((iVar25 != 5) && (iVar25 != 9)) {
    coda_set_error(-300,"CDF file has invalid record type (%d) for AEDR record",iVar25);
    return -1;
  }
  iVar26 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_50);
  if (iVar26 < 0) {
    return -1;
  }
  iVar26 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_58);
  if (iVar26 < 0) {
    return -1;
  }
  iVar26 = read_bytes(product_file->raw_product,offset + 0x18,4,&local_5c);
  if (iVar26 < 0) {
    return -1;
  }
  iVar26 = read_bytes(product_file->raw_product,offset + 0x1c,4,&local_60);
  if (iVar26 < 0) {
    return -1;
  }
  iVar26 = read_bytes(product_file->raw_product,offset + 0x20,4,&local_64);
  if (iVar26 < 0) {
    return -1;
  }
  auVar13._8_6_ = 0;
  auVar13._0_8_ = local_50;
  auVar13[0xe] = (char)(local_50 >> 0x38);
  auVar14._8_4_ = 0;
  auVar14._0_8_ = local_50;
  auVar14[0xc] = (char)(local_50 >> 0x30);
  auVar14._13_2_ = auVar13._13_2_;
  auVar15._8_4_ = 0;
  auVar15._0_8_ = local_50;
  auVar15._12_3_ = auVar14._12_3_;
  auVar16._8_2_ = 0;
  auVar16._0_8_ = local_50;
  auVar16[10] = (char)(local_50 >> 0x28);
  auVar16._11_4_ = auVar15._11_4_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = local_50;
  auVar17._10_5_ = auVar16._10_5_;
  auVar18[8] = (char)(local_50 >> 0x20);
  auVar18._0_8_ = local_50;
  auVar18._9_6_ = auVar17._9_6_;
  auVar27[7] = 0;
  auVar27._0_7_ = auVar18._8_7_;
  auVar21._7_8_ = 0;
  auVar21._0_7_ = auVar18._8_7_;
  auVar23._1_8_ = SUB158(auVar21 << 0x40,7);
  auVar23[0] = (char)(local_50 >> 0x18);
  auVar23._9_6_ = 0;
  auVar22._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar22[0] = (char)(local_50 >> 0x10);
  auVar24._11_4_ = 0;
  auVar24._0_11_ = auVar22;
  auVar19[2] = (char)(local_50 >> 8);
  auVar19._0_2_ = (ushort)local_50;
  auVar19._3_12_ = SUB1512(auVar24 << 0x20,3);
  auVar20._2_13_ = auVar19._2_13_;
  auVar20._0_2_ = (ushort)local_50 & 0xff;
  auVar27._8_4_ = auVar20._0_4_;
  auVar27._12_4_ = auVar22._0_4_;
  auVar27 = pshuflw(auVar27,auVar27,0x1b);
  auVar27 = pshufhw(auVar27,auVar27,0x1b);
  sVar5 = auVar27._0_2_;
  sVar6 = auVar27._2_2_;
  sVar7 = auVar27._4_2_;
  sVar8 = auVar27._6_2_;
  sVar9 = auVar27._8_2_;
  sVar10 = auVar27._10_2_;
  sVar11 = auVar27._12_2_;
  sVar12 = auVar27._14_2_;
  cVar2 = (0 < sVar12) * (sVar12 < 0x100) * auVar27[0xe] - (0xff < sVar12);
  local_50 = CONCAT17(cVar2,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar27[0xc] -
                                     (0xff < sVar11),
                                     CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar27[10] -
                                              (0xff < sVar10),
                                              CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar27[8] -
                                                       (0xff < sVar9),
                                                       CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                                auVar27[6] - (0xff < sVar8),
                                                                CONCAT12((0 < sVar7) *
                                                                         (sVar7 < 0x100) *
                                                                         auVar27[4] - (0xff < sVar7)
                                                                         ,CONCAT11((0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar27[2] -
                                                                                   (0xff < sVar6),
                                                                                   (0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar27[0] -
                                                                                   (0xff < sVar5))))
                                                      ))));
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_58 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_58 >> 0x10),local_58))
                                                  >> 0x20),local_58) >> 0x18),
                                       CONCAT12((char)((uint)local_58 >> 8),(short)local_58)) >>
                             0x10),(short)local_58) & 0xffff00ff00ff00ff;
  auVar27 = pshuflw(auVar28,auVar28,0x1b);
  sVar5 = auVar27._0_2_;
  sVar6 = auVar27._2_2_;
  sVar7 = auVar27._4_2_;
  sVar8 = auVar27._6_2_;
  cVar3 = (0 < sVar8) * (sVar8 < 0x100) * auVar27[6] - (0xff < sVar8);
  local_58 = CONCAT13(cVar3,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar27[4] - (0xff < sVar7),
                                     CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar27[2] -
                                              (0xff < sVar6),
                                              (0 < sVar5) * (sVar5 < 0x100) * auVar27[0] -
                                              (0xff < sVar5))));
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_5c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_5c >> 0x10),local_5c))
                                                  >> 0x20),local_5c) >> 0x18),
                                       CONCAT12((char)((uint)local_5c >> 8),(short)local_5c)) >>
                             0x10),(short)local_5c) & 0xffff00ff00ff00ff;
  auVar27 = pshuflw(auVar29,auVar29,0x1b);
  sVar5 = auVar27._0_2_;
  sVar6 = auVar27._2_2_;
  sVar7 = auVar27._4_2_;
  sVar8 = auVar27._6_2_;
  local_5c = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar27[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar27[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar27[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar27[0] - (0xff < sVar5))
                              ));
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_60 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_60 >> 0x10),local_60))
                                                  >> 0x20),local_60) >> 0x18),
                                       CONCAT12((char)((uint)local_60 >> 8),(short)local_60)) >>
                             0x10),(short)local_60) & 0xffff00ff00ff00ff;
  auVar27 = pshuflw(auVar30,auVar30,0x1b);
  sVar5 = auVar27._0_2_;
  sVar6 = auVar27._2_2_;
  sVar7 = auVar27._4_2_;
  sVar8 = auVar27._6_2_;
  local_60 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar27[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar27[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar27[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar27[0] - (0xff < sVar5))
                              ));
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_64 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_64 >> 0x10),local_64))
                                                  >> 0x20),local_64) >> 0x18),
                                       CONCAT12((char)((uint)local_64 >> 8),(short)local_64)) >>
                             0x10),(short)local_64) & 0xffff00ff00ff00ff;
  auVar27 = pshuflw((undefined1  [16])0x0,auVar31,0x1b);
  sVar5 = auVar27._0_2_;
  sVar6 = auVar27._2_2_;
  sVar7 = auVar27._4_2_;
  sVar8 = auVar27._6_2_;
  cVar4 = (0 < sVar8) * (sVar8 < 0x100) * auVar27[6] - (0xff < sVar8);
  local_64 = CONCAT13(cVar4,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar27[4] - (0xff < sVar7),
                                     CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar27[2] -
                                              (0xff < sVar6),
                                              (0 < sVar5) * (sVar5 < 0x100) * auVar27[0] -
                                              (0xff < sVar5))));
  if ((cVar2 < '\0') || (product_file->file_size <= (long)local_50)) {
    message = "CDF file has invalid offset for AEDR record";
  }
  else if (cVar3 < '\0') {
    message = "CDF file has invalid attribute number in AEDR record";
  }
  else {
    local_38 = (long)local_60;
    if (local_38 < 0) {
      message = "CDF file has invalid entry number in AEDR record";
    }
    else {
      if (-1 < cVar4) {
        if (local_5c != 0x20) {
          local_40 = local_50;
          iVar26 = read_attribute(product_file,offset + 0x38,local_5c,local_64,&local_48);
          if (iVar26 != 0) {
            return -1;
          }
          if ((scope & 1U) == 0 || iVar25 != 5) {
            lVar1 = product_file->root_type->num_fields;
            if (lVar1 <= local_38) {
              coda_set_error(-300,
                             "CDF Attribute entry number (%d) is outside range of available variables [0,%ld]"
                             ,local_38,lVar1 + -1);
              return -1;
            }
            type = (coda_cdf_variable *)product_file->root_type->field_type[local_38];
            if (type->backend != coda_backend_cdf) {
              __assert_fail("((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                            ,0x1cb,
                            "int read_AEDR(coda_cdf_product *, int64_t, const char *, int32_t)");
            }
            iVar25 = coda_cdf_variable_add_attribute(type,name,local_48,1);
          }
          else {
            iVar25 = coda_mem_type_add_attribute
                               ((coda_mem_type *)product_file->root_type,name,local_48,1);
          }
          if (iVar25 != 0) {
            coda_dynamic_type_delete(local_48);
            return -1;
          }
          iVar25 = read_AEDR(product_file,local_40,name,scope);
          return -(uint)(iVar25 != 0);
        }
        message = "CDF EPOCH16 data type is not supported";
        iVar25 = -200;
        goto LAB_00123b47;
      }
      message = "CDF file has invalid number of entries in AEDR record";
    }
  }
  iVar25 = -300;
LAB_00123b47:
  coda_set_error(iVar25,message);
  return -1;
}

Assistant:

static int read_AEDR(coda_cdf_product *product_file, int64_t offset, const char *name, int32_t scope)
{
    coda_dynamic_type *attribute;
    int32_t record_type;
    int64_t aedr_next;
    int32_t attr_num;
    int32_t data_type;
    int32_t num;
    int32_t num_elems;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 5 && record_type != 9)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for AEDR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &aedr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &attr_num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num_elems) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&aedr_next);
    swap_int32(&attr_num);
    swap_int32(&data_type);
    swap_int32(&num);
    swap_int32(&num_elems);
#endif
    offset += 56;
    if (aedr_next < 0 || aedr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AEDR record");
        return -1;
    }
    if (attr_num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in AEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid entry number in AEDR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries in AEDR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }

    if (read_attribute(product_file, offset, data_type, num_elems, &attribute) != 0)
    {
        return -1;
    }
    if (record_type == 5 && (scope & 1))
    {
        if (coda_mem_type_add_attribute((coda_mem_type *)product_file->root_type, name, attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }
    else
    {
        if (num < 0 || num >= product_file->root_type->num_fields)
        {
            coda_set_error(CODA_ERROR_PRODUCT,
                           "CDF Attribute entry number (%d) is outside range of available variables " "[0,%ld]", num,
                           product_file->root_type->num_fields - 1);
            return -1;
        }

        assert(((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf);
        if (coda_cdf_variable_add_attribute((coda_cdf_variable *)product_file->root_type->field_type[num], name,
                                            attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }

    if (read_AEDR(product_file, aedr_next, name, scope) != 0)
    {
        return -1;
    }

    return 0;
}